

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPackingFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::UnpackUnorm2x16Case::UnpackUnorm2x16Case
          (UnpackUnorm2x16Case *this,Context *context,ShaderType shaderType)

{
  char *pcVar1;
  VarType local_168;
  allocator<char> local_149;
  string local_148;
  Symbol local_128;
  VarType local_f0;
  allocator<char> local_d1;
  string local_d0;
  Symbol local_b0;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ShaderType local_1c;
  Context *pCStack_18;
  ShaderType shaderType_local;
  Context *context_local;
  UnpackUnorm2x16Case *this_local;
  
  local_1c = shaderType;
  pCStack_18 = context;
  context_local = (Context *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"unpackunorm2x16",&local_61);
  pcVar1 = getShaderTypePostfix(local_1c);
  std::operator+(&local_40,&local_60,pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  ShaderPackingFunctionCase::ShaderPackingFunctionCase
            (&this->super_ShaderPackingFunctionCase,context,pcVar1,"unpackUnorm2x16",local_1c);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__UnpackUnorm2x16Case_015aa418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"in0",&local_d1);
  glu::VarType::VarType(&local_f0,TYPE_UINT,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_b0,&local_d0,&local_f0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::push_back(&(this->super_ShaderPackingFunctionCase).m_spec.inputs,&local_b0);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_b0);
  glu::VarType::~VarType(&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"out0",&local_149);
  glu::VarType::VarType(&local_168,TYPE_FLOAT_VEC2,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_128,&local_148,&local_168);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::push_back(&(this->super_ShaderPackingFunctionCase).m_spec.outputs,&local_128);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_128);
  glu::VarType::~VarType(&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderPackingFunctionCase).m_spec.source,
             "out0 = unpackUnorm2x16(in0);");
  return;
}

Assistant:

UnpackUnorm2x16Case (Context& context, glu::ShaderType shaderType)
		: ShaderPackingFunctionCase(context, (string("unpackunorm2x16") + getShaderTypePostfix(shaderType)).c_str(), "unpackUnorm2x16", shaderType)
	{
		m_spec.inputs.push_back(Symbol("in0", glu::VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_HIGHP)));

		m_spec.source = "out0 = unpackUnorm2x16(in0);";
	}